

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O0

void __thiscall
jsoncons::
index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::
index_key_value<jsoncons::byte_string_arg_t_const&,jsoncons::byte_string_view_const&,unsigned_long&>
          (index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,key_type *Name,int64_t Index,byte_string_arg_t *args,byte_string_view *args_1,
          unsigned_long *args_2)

{
  undefined8 uVar1;
  undefined8 in_RDX;
  string *in_RSI;
  string *in_RDI;
  undefined8 in_R8;
  undefined8 *in_R9;
  allocator<char> local_32 [2];
  undefined8 *local_30;
  undefined8 local_28;
  undefined8 local_18;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined8 *)(in_RDI + 0x20) = local_18;
  uVar1 = *local_30;
  std::allocator<char>::allocator();
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
  basic_json<jsoncons::byte_string_view>
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             (in_RDI + 0x28),local_28,uVar1,local_32,0);
  std::allocator<char>::~allocator(local_32);
  return;
}

Assistant:

index_key_value(key_type&& Name, int64_t Index, Args&& ... args) 
            : name(std::move(Name)), index(Index), value(std::forward<Args>(args)...)
        {
        }